

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O1

VW_HANDLE VW_InitializeA(char *pstrArgs)

{
  vw *pvVar1;
  string s;
  allocator local_51;
  string local_50;
  undefined1 *local_30;
  long local_28;
  undefined1 local_20 [16];
  
  std::__cxx11::string::string((string *)&local_30,pstrArgs,&local_51);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_30,local_30 + local_28);
  pvVar1 = VW::initialize(&local_50,(io_buf *)0x0,false,(trace_message_t)0x0,(void *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return pvVar1;
}

Assistant:

VW_DLL_MEMBER VW_HANDLE VW_CALLING_CONV VW_InitializeA(const char * pstrArgs)
{ string s(pstrArgs);
  vw* all = VW::initialize(s);
  return static_cast<VW_HANDLE>(all);
}